

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextDiagnosticClient.cpp
# Opt level: O1

void __thiscall
slang::SourceSnippet::SourceSnippet(SourceSnippet *this,string_view sourceLine,uint32_t tabStop)

{
  char *pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  byte *b;
  byte bVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  char *pcVar8;
  ulong uVar9;
  uint32_t j;
  uint uVar10;
  byte *pbVar11;
  size_type sVar12;
  long lVar13;
  ptrdiff_t _Num;
  size_t __n;
  SourceSnippet *pSVar14;
  ulong uVar15;
  uint32_t c;
  int error;
  char buf [4];
  SmallVector<char,_40UL> buffer;
  uint32_t local_114;
  SourceSnippet *local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_100;
  char *local_f8;
  char *local_f0;
  int local_e4;
  SmallVectorBase<char> local_e0;
  string *local_c0;
  size_t local_b8;
  reverse_iterator<char_*> local_b0;
  uint32_t local_a4;
  SmallVectorBase<char> local_a0 [2];
  string *local_60;
  byte *local_58;
  SmallVectorBase<std::pair<unsigned_long,unsigned_long>> *local_50;
  char *local_48;
  long local_40;
  reverse_iterator<char_*> local_38;
  
  local_48 = sourceLine._M_str;
  local_b8 = sourceLine._M_len;
  pcVar8 = (this->byteToColumn).super_SmallVectorBase<int>.firstElement;
  (this->byteToColumn).super_SmallVectorBase<int>.data_ = (pointer)pcVar8;
  (this->byteToColumn).super_SmallVectorBase<int>.len = 0;
  (this->byteToColumn).super_SmallVectorBase<int>.cap = 10;
  local_50 = (SmallVectorBase<std::pair<unsigned_long,unsigned_long>> *)&this->invalidRanges;
  pcVar1 = (this->invalidRanges).super_SmallVectorBase<std::pair<unsigned_long,_unsigned_long>_>.
           firstElement;
  (this->invalidRanges).super_SmallVectorBase<std::pair<unsigned_long,_unsigned_long>_>.data_ =
       (pointer)pcVar1;
  (this->invalidRanges).super_SmallVectorBase<std::pair<unsigned_long,_unsigned_long>_>.len = 0;
  (this->invalidRanges).super_SmallVectorBase<std::pair<unsigned_long,_unsigned_long>_>.cap = 4;
  local_c0 = &this->snippetLine;
  paVar2 = &(this->snippetLine).field_2;
  (this->snippetLine)._M_dataplus._M_p = (pointer)paVar2;
  (this->snippetLine)._M_string_length = 0;
  (this->snippetLine).field_2._M_local_buf[0] = '\0';
  local_60 = (string *)&this->highlightLine;
  paVar3 = &(this->highlightLine).field_2;
  (this->highlightLine)._M_dataplus._M_p = (pointer)paVar3;
  (this->highlightLine)._M_string_length = 0;
  (this->highlightLine).field_2._M_local_buf[0] = '\0';
  local_a4 = tabStop;
  if (local_b8 == 0) {
    assert::assertFailed
              ("!sourceLine.empty()",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/diagnostics/TextDiagnosticClient.cpp"
               ,0xbc,"slang::SourceSnippet::SourceSnippet(string_view, uint32_t)");
  }
  SmallVectorBase<int>::resizeImpl<slang::SmallVectorBase<int>::ValueInitTag>
            ((SmallVectorBase<int> *)this,local_b8 + 1,(ValueInitTag *)local_a0);
  sVar12 = (this->byteToColumn).super_SmallVectorBase<int>.len;
  if (sVar12 != 0) {
    memset((this->byteToColumn).super_SmallVectorBase<int>.data_,0xff,sVar12 << 2);
  }
  std::__cxx11::string::reserve((ulong)local_c0);
  local_a0[0].data_ = local_a0[0].firstElement;
  local_a0[0].len = 0;
  local_a0[0].cap = 0x28;
  lVar13 = 0;
  uVar15 = 0;
  local_110 = this;
  local_108 = paVar3;
  local_100 = paVar2;
  local_f8 = pcVar1;
  local_f0 = pcVar8;
  do {
    pSVar14 = local_110;
    if ((local_110->byteToColumn).super_SmallVectorBase<int>.len <= uVar15) goto LAB_00160471;
    (local_110->byteToColumn).super_SmallVectorBase<int>.data_[uVar15] = (int)lVar13;
    local_a0[0].len = 0;
    local_40 = lVar13;
    if (local_48[uVar15] == '\t') {
      uVar10 = 0;
      uVar6 = 0;
      if (uVar15 != 0) {
        uVar6 = 0;
        uVar9 = uVar15;
        do {
          if (local_48[uVar9 - 1] == '\t') goto LAB_001600f9;
          uVar9 = uVar9 - 1;
          uVar6 = uVar6 + 1;
        } while (uVar9 != 0);
        uVar6 = (uint)uVar15;
      }
LAB_001600f9:
      uVar6 = local_a4 - uVar6 % local_a4;
      uVar15 = uVar15 + 1;
      do {
        local_e0.data_ = (pointer)CONCAT71(local_e0.data_._1_7_,0x20);
        SmallVectorBase<char>::emplace_back<char>(local_a0,(char *)&local_e0);
        uVar10 = uVar10 + 1;
      } while (uVar10 < uVar6);
      bVar5 = true;
      sVar12 = local_a0[0].len;
    }
    else {
      b = (byte *)(local_48 + uVar15);
      if (local_b8 < uVar15 + 4) {
        local_e0.data_ = (pointer)((ulong)local_e0.data_ & 0xffffffff00000000);
        memcpy(&local_e0,b,local_b8 - uVar15);
        pcVar8 = utf8Decode((char *)&local_e0,&local_114,&local_e4);
        pbVar11 = b + ((long)pcVar8 - (long)&local_e0);
      }
      else {
        pbVar11 = (byte *)utf8Decode((char *)b,&local_114,&local_e4);
      }
      if (local_e4 == 0) {
        local_58 = b;
        bVar5 = isPrintableUnicode(local_114);
        uVar15 = (long)pbVar11 - (long)local_48;
        if (bVar5) {
          __n = (long)pbVar11 - (long)local_58;
          sVar12 = local_a0[0].len + __n;
          SmallVectorBase<char>::reserve(local_a0,sVar12);
          if (pbVar11 != local_58) {
            memmove(local_a0[0].data_ + local_a0[0].len,local_58,__n);
          }
          local_a0[0].len = sVar12;
          iVar7 = charWidthUnicode(local_114);
          sVar12 = (size_type)iVar7;
          bVar5 = true;
          pSVar14 = local_110;
        }
        else {
          local_e0.data_ = local_e0.firstElement;
          local_e0.len = 0;
          local_e0.cap = 8;
          if (local_114 != 0) {
            do {
              local_b0.current._0_1_ = "0123456789ABCDEF"[local_114 & 0xf];
              SmallVectorBase<char>::emplace_back<char>(&local_e0,(char *)&local_b0);
              uVar6 = local_114 >> 4;
              bVar5 = 0xf < local_114;
              local_114 = uVar6;
            } while (bVar5);
          }
          sVar12 = local_a0[0].len + 3;
          SmallVectorBase<char>::reserve(local_a0,sVar12);
          pSVar14 = local_110;
          local_a0[0].data_[local_a0[0].len + 2] = '+';
          *(undefined2 *)(local_a0[0].data_ + local_a0[0].len) = 0x553c;
          local_b0.current = local_e0.data_ + local_e0.len;
          local_38.current = local_e0.data_;
          local_a0[0].len = sVar12;
          SmallVectorBase<char>::append<std::reverse_iterator<char*>,void>
                    (local_a0,&local_b0,&local_38);
          local_b0.current._0_1_ = 0x3e;
          SmallVectorBase<char>::emplace_back<char>(local_a0,(char *)&local_b0);
          sVar12 = local_a0[0].len;
          if (local_e0.data_ != local_e0.firstElement) {
            free(local_e0.data_);
          }
          bVar5 = false;
        }
      }
      else {
        bVar4 = *b;
        sVar12 = local_a0[0].len + 4;
        SmallVectorBase<char>::reserve(local_a0,sVar12);
        *(undefined4 *)(local_a0[0].data_ + local_a0[0].len) = 0x3e58583c;
        local_a0[0].len = sVar12;
        if (sVar12 < 2) {
LAB_00160490:
          assert::assertFailed
                    ("index < len",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/SmallVector.h"
                     ,0x196,
                     "reference slang::SmallVectorBase<char>::operator[](size_type) [T = char]");
        }
        local_a0[0].data_[1] = "0123456789ABCDEF"[bVar4 >> 4];
        if (sVar12 < 3) goto LAB_00160490;
        uVar15 = uVar15 + 1;
        local_a0[0].data_[2] = "0123456789ABCDEF"[bVar4 & 0xf];
        bVar5 = false;
        pSVar14 = local_110;
      }
    }
    if (!bVar5) {
      local_e0.data_ = (pointer)(pSVar14->snippetLine)._M_string_length;
      local_e0.len = local_a0[0].len;
      SmallVectorBase<std::pair<unsigned_long,unsigned_long>>::
      emplace_back<std::pair<unsigned_long,unsigned_long>>
                (local_50,(pair<unsigned_long,_unsigned_long> *)&local_e0);
    }
    std::__cxx11::string::append((char *)local_c0,(ulong)local_a0[0].data_);
    lVar13 = local_40 + sVar12;
  } while (uVar15 < local_b8);
  if (local_b8 < (local_110->byteToColumn).super_SmallVectorBase<int>.len) {
    (local_110->byteToColumn).super_SmallVectorBase<int>.data_[local_b8] = (int)lVar13;
    local_e0.data_ = (pointer)&local_e0.cap;
    std::__cxx11::string::_M_construct((ulong)&local_e0,(char)lVar13);
    std::__cxx11::string::operator=(local_60,(string *)&local_e0);
    if ((size_type *)local_e0.data_ != &local_e0.cap) {
      operator_delete(local_e0.data_,local_e0.cap + 1);
    }
    if (local_a0[0].data_ != local_a0[0].firstElement) {
      free(local_a0[0].data_);
    }
    return;
  }
LAB_00160471:
  assert::assertFailed
            ("index < len",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/SmallVector.h"
             ,0x196,"reference slang::SmallVectorBase<int>::operator[](size_type) [T = int]");
}

Assistant:

SourceSnippet(string_view sourceLine, uint32_t tabStop) {
        ASSERT(!sourceLine.empty());

        byteToColumn.resize(sourceLine.size() + 1);
        for (size_t i = 0; i < byteToColumn.size(); i++)
            byteToColumn[i] = -1;

        snippetLine.reserve(sourceLine.size());

        SmallVector<char> buffer;
        size_t column = 0;
        size_t i = 0;
        while (i < sourceLine.size()) {
            byteToColumn[i] = (int)column;

            size_t columnWidth;
            buffer.clear();
            if (!printableTextForNextChar(sourceLine, i, tabStop, buffer, columnWidth))
                invalidRanges.push_back({snippetLine.size(), buffer.size()});

            snippetLine.append(buffer.data(), buffer.size());
            column += columnWidth;
        }

        byteToColumn[sourceLine.size()] = (int)column;
        highlightLine = std::string(column, ' ');
    }